

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fStencilTests.cpp
# Opt level: O2

void __thiscall deqp::gles2::Functional::StencilShader::~StencilShader(StencilShader *this)

{
  sglr::ShaderProgram::~ShaderProgram(&this->super_ShaderProgram);
  operator_delete(this,0x160);
  return;
}

Assistant:

StencilShader (void)
		: sglr::ShaderProgram(sglr::pdec::ShaderProgramDeclaration()
									<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
									<< sglr::pdec::VertexToFragmentVarying(rr::GENERICVECTYPE_FLOAT)
									<< sglr::pdec::FragmentOutput(rr::GENERICVECTYPE_FLOAT)
									<< sglr::pdec::Uniform("u_color", glu::TYPE_FLOAT_VEC4)
									<< sglr::pdec::VertexSource("attribute highp vec4 a_position;\n"
																"void main (void)\n"
																"{\n"
																"	gl_Position = a_position;\n"
																"}\n")
									<< sglr::pdec::FragmentSource("uniform mediump vec4 u_color;\n"
																  "void main (void)\n"
																  "{\n"
																  "	gl_FragColor = u_color;\n"
																  "}\n"))
		, u_color	(getUniformByName("u_color"))
	{
	}